

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_shader_ballot_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  uint32_t op0;
  undefined4 in_register_0000000c;
  uint32_t op1;
  undefined4 in_register_0000008c;
  char *op;
  uint32_t local_54;
  string local_50;
  
  local_54 = eop;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_AMD_shader_ballot","",CONCAT44(in_register_0000000c,eop),args,
             CONCAT44(in_register_0000008c,param_5));
  require_extension_internal(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  switch(local_54) {
  case 1:
    op0 = *args;
    op1 = args[1];
    op = "swizzleInvocationsAMD";
    break;
  case 2:
    op0 = *args;
    op1 = args[1];
    op = "swizzleInvocationsMaskedAMD";
    break;
  case 3:
    emit_trinary_func_op(this,result_type,id,*args,args[1],args[2],"writeInvocationAMD");
    goto LAB_001f8267;
  case 4:
    emit_unary_func_op(this,result_type,id,*args,"mbcntAMD");
    goto LAB_001f8267;
  default:
    statement<char_const(&)[43],unsigned_int&>
              (this,(char (*) [43])"// unimplemented SPV AMD shader ballot op ",&local_54);
    return;
  }
  emit_binary_func_op(this,result_type,id,op0,op1,op);
LAB_001f8267:
  register_control_dependent_expression(this,id);
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_shader_ballot_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args,
                                                 uint32_t)
{
	require_extension_internal("GL_AMD_shader_ballot");

	enum AMDShaderBallot
	{
		SwizzleInvocationsAMD = 1,
		SwizzleInvocationsMaskedAMD = 2,
		WriteInvocationAMD = 3,
		MbcntAMD = 4
	};

	auto op = static_cast<AMDShaderBallot>(eop);

	switch (op)
	{
	case SwizzleInvocationsAMD:
		emit_binary_func_op(result_type, id, args[0], args[1], "swizzleInvocationsAMD");
		register_control_dependent_expression(id);
		break;

	case SwizzleInvocationsMaskedAMD:
		emit_binary_func_op(result_type, id, args[0], args[1], "swizzleInvocationsMaskedAMD");
		register_control_dependent_expression(id);
		break;

	case WriteInvocationAMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "writeInvocationAMD");
		register_control_dependent_expression(id);
		break;

	case MbcntAMD:
		emit_unary_func_op(result_type, id, args[0], "mbcntAMD");
		register_control_dependent_expression(id);
		break;

	default:
		statement("// unimplemented SPV AMD shader ballot op ", eop);
		break;
	}
}